

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

char * zt_cstr_strip(char *str)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  
  sVar1 = strspn(str," \t");
  sVar2 = strlen(str);
  memmove(str,str + sVar1,(sVar2 - sVar1) + 1);
  sVar3 = zt_cstr_rspn(str," \t\n");
  sVar1 = strlen(str);
  lVar5 = sVar1 - sVar3;
  if (lVar5 != 0) {
    pcVar4 = strchr(str,10);
    if (pcVar4 != (char *)0x0) {
      str[lVar5] = '\n';
      lVar5 = lVar5 + 1;
    }
    str[lVar5] = '\0';
  }
  return str;
}

Assistant:

char*
zt_cstr_strip(char *str) {
    zt_assert(str);
    {
        /* strip whitespace from the beginning of the string */
        size_t    len = 0;
        int       nl  = 0;

        len = strspn(str, WHITESPACE);
        memmove(str, &str[len], (strlen(str) - len) + 1); /* +1 captures \0 */

        /* strip whitespace from the end of the string */
        if (strchr(str, '\n') != NULL) {
            nl = 1;
        }
        len = zt_cstr_rspn(str, WHITESPACE "\n");
        len = strlen(str) - len;
        if (len) {
            if (nl) {
                str[len++] = '\n';
            }
            str[len] = '\0';
        }
    }
    return str;
}